

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv.h
# Opt level: O3

int_mv gm_get_motion_vector
                 (WarpedMotionParams *gm,int allow_hp,BLOCK_SIZE bsize,int mi_col,int mi_row,
                 int is_integer)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  ushort uVar8;
  
  if (gm->wmtype == '\0') {
    uVar3 = 0;
    uVar1 = 0;
  }
  else {
    if (gm->wmtype == '\x01') {
      uVar1 = (uint)gm->wmmat[0] >> 0xd;
      uVar3 = (uint)gm->wmmat[1] >> 0xd;
    }
    else {
      iVar7 = (uint)(block_size_wide[bsize] >> 1) + mi_col * 4 + -1;
      iVar4 = (uint)(block_size_high[bsize] >> 1) + mi_row * 4 + -1;
      iVar2 = (gm->wmmat[2] + -0x10000) * iVar7 + gm->wmmat[0] + gm->wmmat[3] * iVar4;
      iVar4 = iVar7 * gm->wmmat[4] + gm->wmmat[1] + (gm->wmmat[5] + -0x10000) * iVar4;
      if (allow_hp == 0) {
        if (iVar2 < 0) {
          uVar3 = -(0x2000U - iVar2 >> 0xe);
        }
        else {
          uVar3 = iVar2 + 0x2000U >> 0xe;
        }
        if (iVar4 < 0) {
          uVar1 = -(0x2000U - iVar4 >> 0xe);
        }
        else {
          uVar1 = iVar4 + 0x2000U >> 0xe;
        }
        uVar3 = uVar3 * 2;
        uVar1 = uVar1 * 2;
      }
      else {
        if (iVar2 < 0) {
          uVar3 = -(0x1000U - iVar2 >> 0xd);
        }
        else {
          uVar3 = iVar2 + 0x1000U >> 0xd;
        }
        if (iVar4 < 0) {
          uVar1 = -(0x1000U - iVar4 >> 0xd);
        }
        else {
          uVar1 = iVar4 + 0x1000U >> 0xd;
        }
      }
    }
    uVar6 = (ushort)uVar3;
    uVar5 = (ushort)uVar1;
    if (is_integer != 0) {
      uVar8 = uVar5 + 7;
      if (-1 < (short)uVar5) {
        uVar8 = uVar5;
      }
      uVar5 = uVar5 - (uVar8 & 0xfff8);
      if (uVar5 != 0) {
        uVar1 = uVar1 - uVar5;
        uVar8 = -uVar5;
        if (0 < (short)uVar5) {
          uVar8 = uVar5;
        }
        if (4 < uVar8) {
          uVar1 = (uVar1 + (uint)(0 < (short)uVar5) * 0x10) - 8;
        }
      }
      uVar5 = uVar6 + 7;
      if (-1 < (short)uVar6) {
        uVar5 = uVar6;
      }
      uVar6 = uVar6 - (uVar5 & 0xfff8);
      if (uVar6 != 0) {
        uVar3 = uVar3 - uVar6;
        uVar5 = -uVar6;
        if (0 < (short)uVar6) {
          uVar5 = uVar6;
        }
        if (4 < uVar5) {
          uVar3 = (uVar3 + (uint)(0 < (short)uVar6) * 0x10) - 8;
        }
      }
    }
  }
  return (int_mv)(uVar1 & 0xffff | uVar3 << 0x10);
}

Assistant:

static inline int_mv gm_get_motion_vector(const WarpedMotionParams *gm,
                                          int allow_hp, BLOCK_SIZE bsize,
                                          int mi_col, int mi_row,
                                          int is_integer) {
  int_mv res;

  if (gm->wmtype == IDENTITY) {
    res.as_int = 0;
    return res;
  }

  const int32_t *mat = gm->wmmat;
  int x, y, tx, ty;

  if (gm->wmtype == TRANSLATION) {
    // All global motion vectors are stored with WARPEDMODEL_PREC_BITS (16)
    // bits of fractional precision. The offset for a translation is stored in
    // entries 0 and 1. For translations, all but the top three (two if
    // cm->features.allow_high_precision_mv is false) fractional bits are always
    // zero.
    //
    // After the right shifts, there are 3 fractional bits of precision. If
    // allow_hp is false, the bottom bit is always zero (so we don't need a
    // call to convert_to_trans_prec here)
    //
    // Note: There is an AV1 specification bug here:
    //
    // gm->wmmat[0] is supposed to be the horizontal translation, and so should
    // go into res.as_mv.col, and gm->wmmat[1] is supposed to be the vertical
    // translation and so should go into res.as_mv.row
    //
    // However, in the spec, these assignments are accidentally reversed, and so
    // we must keep this incorrect logic to match the spec.
    //
    // See also: https://crbug.com/aomedia/3328
    res.as_mv.row = gm->wmmat[0] >> GM_TRANS_ONLY_PREC_DIFF;
    res.as_mv.col = gm->wmmat[1] >> GM_TRANS_ONLY_PREC_DIFF;
    assert(IMPLIES(1 & (res.as_mv.row | res.as_mv.col), allow_hp));
    if (is_integer) {
      integer_mv_precision(&res.as_mv);
    }
    return res;
  }

  x = block_center_x(mi_col, bsize);
  y = block_center_y(mi_row, bsize);

  if (gm->wmtype == ROTZOOM) {
    assert(gm->wmmat[5] == gm->wmmat[2]);
    assert(gm->wmmat[4] == -gm->wmmat[3]);
  }

  const int xc =
      (mat[2] - (1 << WARPEDMODEL_PREC_BITS)) * x + mat[3] * y + mat[0];
  const int yc =
      mat[4] * x + (mat[5] - (1 << WARPEDMODEL_PREC_BITS)) * y + mat[1];
  tx = convert_to_trans_prec(allow_hp, xc);
  ty = convert_to_trans_prec(allow_hp, yc);

  res.as_mv.row = ty;
  res.as_mv.col = tx;

  if (is_integer) {
    integer_mv_precision(&res.as_mv);
  }
  return res;
}